

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

uint read_chr(lexer *lexer)

{
  uint uVar1;
  
  uVar1 = 0xc9;
  if ((FILE *)lexer->file != (FILE *)0x0) {
    uVar1 = lexer->last_chr;
    if (uVar1 == 0xd1) {
      uVar1 = fgetc((FILE *)lexer->file);
      if (uVar1 == 0xffffffff) {
        fclose((FILE *)lexer->file);
        lexer->file = (FILE *)0x0;
        uVar1 = 0xc9;
      }
      else {
        lexer->col_pos = lexer->col_pos + 1;
      }
    }
    else {
      lexer->last_chr = 0xd1;
    }
  }
  return uVar1;
}

Assistant:

uint read_chr(struct lexer *lexer) {
    if (lexer->file == NULL) return END;
    uint chr;
    if (lexer->last_chr != EMPTY) {
        chr = lexer->last_chr;
        lexer->last_chr = EMPTY;
        return chr;
    }
    if ((chr = fgetc(lexer->file)) == EOF) {
        fclose(lexer->file); // 关流
        lexer->file = NULL;
        return END;
    }
    lexer->col_pos++;
    return chr;
}